

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<int,_std::allocator<int>_> *v,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  bool bVar1;
  reference piVar2;
  undefined8 in_RSI;
  BasicWriter<char> *in_RDI;
  size_t in_stack_00000020;
  ItemNamer *in_stack_00000028;
  int *el;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  int n;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  undefined8 local_28;
  int local_1c;
  undefined8 local_10;
  BasicWriter<char> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  local_1c = -1;
  local_28 = local_10;
  local_30._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff90,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_30);
    local_1c = local_1c + 1;
    if (local_1c != 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      value.size_ = (size_t)piVar2;
      value.data_ = in_stack_ffffffffffffffb8;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value);
    }
    in_stack_ffffffffffffff90 = local_8;
    ItemNamer::at(in_stack_00000028,in_stack_00000020);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    value_00.size_ = (size_t)piVar2;
    value_00.data_ = in_stack_ffffffffffffffb8;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_00);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}